

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_IsExtensible(JSContext *ctx,JSValue obj)

{
  uint uVar1;
  uint uVar2;
  JSProxyData *argv;
  int64_t iVar3;
  JSValueUnion JVar4;
  JSValue func_obj;
  JSValue obj_00;
  JSValue JVar5;
  JSValueUnion JStack_30;
  int64_t iStack_28;
  
  iVar3 = obj.tag;
  JVar4 = obj.u;
  if ((int)obj.tag != -1) {
    return 0;
  }
  if (*(short *)((long)JVar4.ptr + 6) != 0x29) {
    return *(byte *)((long)JVar4.ptr + 5) & 1;
  }
  do {
    JVar5.tag = iVar3;
    JVar5.u.ptr = JVar4.ptr;
    argv = get_proxy_method(ctx,(JSValue *)&JStack_30,JVar5,0x61);
    if (argv == (JSProxyData *)0x0) {
      return -1;
    }
    if ((int)iStack_28 != 3) {
      func_obj.tag = iStack_28;
      func_obj.u.float64 = JStack_30.float64;
      JVar5 = JS_CallFree(ctx,func_obj,argv->handler,1,&argv->target);
      if ((int)JVar5.tag == 6) {
        return -1;
      }
      uVar1 = JS_ToBoolFree(ctx,JVar5);
      iVar3 = (argv->target).tag;
      if ((int)iVar3 == -1) {
        JVar4.ptr = (argv->target).u.ptr;
        if (*(short *)((long)JVar4.ptr + 6) == 0x29) {
          obj_00.tag = iVar3;
          obj_00.u.ptr = JVar4.ptr;
          uVar2 = js_proxy_isExtensible(ctx,obj_00);
          if ((int)uVar2 < 0) {
            return -1;
          }
        }
        else {
          uVar2 = *(byte *)((long)JVar4.ptr + 5) & 1;
        }
      }
      else {
        uVar2 = 0;
      }
      if (uVar1 != uVar2) {
        JS_ThrowTypeError(ctx,"proxy: inconsistent isExtensible");
        return -1;
      }
      return uVar1;
    }
    iVar3 = (argv->target).tag;
    if ((int)iVar3 != -1) {
      return 0;
    }
    JVar4.ptr = (argv->target).u.ptr;
  } while (*(short *)((long)JVar4.ptr + 6) == 0x29);
  return *(byte *)((long)JVar4.ptr + 5) & 1;
}

Assistant:

int JS_IsExtensible(JSContext *ctx, JSValueConst obj)
{
    JSObject *p;

    if (unlikely(JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT))
        return FALSE;
    p = JS_VALUE_GET_OBJ(obj);
    if (unlikely(p->class_id == JS_CLASS_PROXY))
        return js_proxy_isExtensible(ctx, obj);
    else
        return p->extensible;
}